

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall
QOpenGLTexture::setSwizzleMask
          (QOpenGLTexture *this,SwizzleValue r,SwizzleValue g,SwizzleValue b,SwizzleValue a)

{
  QOpenGLTexturePrivate *this_00;
  char cVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  SwizzleValue local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::currentContext();
  cVar1 = QOpenGLContext::isOpenGLES();
  if (cVar1 == '\0') {
    this_00 = (this->d_ptr).d;
    QOpenGLTexturePrivate::create(this_00);
    if (((this_00->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
         super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x100) != 0) {
      local_54 = CONCAT44(b,g);
      uStack_4c = CONCAT44(uStack_4c._4_4_,a);
      this_00->swizzleMask[0] = r;
      this_00->swizzleMask[1] = g;
      this_00->swizzleMask[2] = b;
      this_00->swizzleMask[3] = a;
      local_58 = r;
      QOpenGLTextureHelper::glTextureParameteriv
                (this_00->texFuncs,this_00->textureId,this_00->target,this_00->bindingTarget,0x8e46,
                 (GLint *)&local_58);
      goto LAB_00154504;
    }
    pcVar2 = "QOpenGLTexture::setSwizzleMask() requires OpenGL >= 3.3";
  }
  else {
    pcVar2 = "QOpenGLTexture: Texture swizzling is not supported";
  }
  local_40 = "default";
  local_44 = 0;
  uStack_4c = 0;
  local_54 = 0;
  local_58 = 2;
  QMessageLogger::warning((char *)&local_58,pcVar2);
LAB_00154504:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexture::setSwizzleMask(SwizzleValue r, SwizzleValue g,
                                    SwizzleValue b, SwizzleValue a)
{
#if !defined(Q_OS_MAC) && !QT_CONFIG(opengles2)
    if (!QOpenGLContext::currentContext()->isOpenGLES()) {
        Q_D(QOpenGLTexture);
        d->create();
        Q_ASSERT(d->texFuncs);
        Q_ASSERT(d->textureId);
        if (!d->features.testFlag(Swizzle)) {
            qWarning("QOpenGLTexture::setSwizzleMask() requires OpenGL >= 3.3");
            return;
        }
        GLint swizzleMask[] = {GLint(r), GLint(g), GLint(b), GLint(a)};
        d->swizzleMask[0] = r;
        d->swizzleMask[1] = g;
        d->swizzleMask[2] = b;
        d->swizzleMask[3] = a;
        d->texFuncs->glTextureParameteriv(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
        return;
    }
#else
    Q_UNUSED(r);
    Q_UNUSED(g);
    Q_UNUSED(b);
    Q_UNUSED(a);
#endif
    qWarning("QOpenGLTexture: Texture swizzling is not supported");
}